

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void output_defines(void)

{
  FILE *__stream;
  FILE *pFVar1;
  int iVar2;
  char *__ptr;
  ushort **ppuVar3;
  char *tmp;
  char *p;
  FILE *dc_file;
  char *s;
  int i;
  int c;
  
  if (dflag != '\0') {
    __ptr = strdup(defines_file_name);
    for (tmp = __ptr; *tmp != '\0'; tmp = tmp + 1) {
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)*tmp] & 8) == 0) {
        *tmp = '_';
      }
    }
    fprintf((FILE *)defines_file,"#ifndef _%s_\n",__ptr);
    fprintf((FILE *)defines_file,"#define _%s_\n\n",__ptr);
    free(__ptr);
  }
  pFVar1 = defines_file;
  __stream = (FILE *)code_file;
  if ((dflag != '\0') && (__stream = (FILE *)pFVar1, include_defines == '\0')) {
    outline = outline + 2;
    fprintf((FILE *)code_file,"#include \"%s\"\n\n",defines_file_name);
    include_defines = '\x01';
  }
  for (s._0_4_ = 2; (int)s < ntokens; s._0_4_ = (int)s + 1) {
    dc_file = (FILE *)symbol_name[(int)s];
    iVar2 = is_C_identifier((char *)dc_file);
    if (iVar2 != 0) {
      fprintf(__stream,"#define ");
      s._4_4_ = (int)(char)dc_file->_flags;
      if (s._4_4_ == 0x22) {
        while( true ) {
          iVar2 = (int)*(char *)((long)&dc_file->_flags + 1);
          if (iVar2 == 0x22) break;
          putc(iVar2,__stream);
          dc_file = (FILE *)((long)&dc_file->_flags + 1);
        }
      }
      else {
        do {
          putc(s._4_4_,__stream);
          s._4_4_ = (int)*(char *)((long)&dc_file->_flags + 1);
          dc_file = (FILE *)((long)&dc_file->_flags + 1);
        } while (s._4_4_ != 0);
      }
      if (dflag == '\0') {
        outline = outline + 1;
      }
      fprintf(__stream," %d\n",(ulong)(uint)symbol_value[(int)s]);
    }
  }
  if (dflag == '\0') {
    outline = outline + 1;
  }
  fprintf(__stream,"#define YYERRCODE %d\n",(ulong)(uint)symbol_value[1]);
  if ((dflag != '\0') && ((unionized != '\0' || (location_defined != '\0')))) {
    fclose((FILE *)union_file);
    union_file = (FILE *)fopen(union_file_name,"r");
    if ((FILE *)union_file == (FILE *)0x0) {
      open_error(union_file_name);
    }
    while (iVar2 = getc((FILE *)union_file), iVar2 != -1) {
      putc(iVar2,(FILE *)defines_file);
    }
    if (unionized != '\0') {
      fprintf((FILE *)defines_file,"extern YYSTYPE %slval;\n",symbol_prefix);
    }
  }
  if (dflag != '\0') {
    fprintf((FILE *)defines_file,"#if defined(YYPOSN)\nextern YYPOSN yyposn;\n#endif\n");
    fprintf((FILE *)defines_file,"\n#endif\n");
  }
  return;
}

Assistant:

void output_defines()
{
    register int c, i;
    register char *s;
    FILE *dc_file;

    if(dflag) {
	char *p, *tmp = strdup(defines_file_name);
	for (p = tmp; *p; p++)
	    if (!isalnum(*p))
		*p = '_';
	fprintf(defines_file, "#ifndef _%s_\n", tmp);
	fprintf(defines_file, "#define _%s_\n\n", tmp);
	free(tmp);
    }

    /* VM: Print to either code file or defines file but not to both */
    dc_file = dflag ? defines_file : code_file;
    if (dflag && !include_defines) {
	outline += 2;
	fprintf(code_file, "#include \"%s\"\n\n", defines_file_name);
	include_defines = 1; }

    for (i = 2; i < ntokens; ++i)
    {
	s = symbol_name[i];
	if (is_C_identifier(s))
	{
	    fprintf(dc_file, "#define ");
	    c = *s;
	    if (c == '"')
	    {
		while ((c = *++s) != '"')
		{
		    putc(c, dc_file);
		}
	    }
	    else
	    {
		do
		{
		    putc(c, dc_file);
		}
		while ((c = *++s));
	    }
	    if (!dflag) ++outline;
	    fprintf(dc_file, " %d\n", symbol_value[i]);
	}
    }

    if (!dflag) ++outline;
    fprintf(dc_file, "#define YYERRCODE %d\n", symbol_value[1]);

    if (dflag && (unionized || location_defined))
    {
	fclose(union_file);
	union_file = fopen(union_file_name, "r");
	if (union_file == NULL) open_error(union_file_name);
	while ((c = getc(union_file)) != EOF) {
	  putc(c, defines_file);
	}
	if (unionized)
	    fprintf(defines_file, "extern YYSTYPE %slval;\n", symbol_prefix);
    }

    if(dflag) {
	fprintf(defines_file, "#if defined(YYPOSN)\n"
			      "extern YYPOSN yyposn;\n"
			      "#endif\n");
	fprintf(defines_file, "\n#endif\n");
    }
}